

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
CancelVoteIRCCommand::trigger
          (CancelVoteIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view sVar1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  Channel *pCVar2;
  CancelVoteIRCCommand *pCVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  reference ppSVar8;
  char *pcVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  Server **server_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range2_1;
  Server **server;
  const_iterator __end2;
  const_iterator __begin2;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range2;
  char *local_230;
  TeamType target;
  bool cancel_all;
  size_t local_98;
  char *local_90;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_70 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_58;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_48;
  long local_40;
  Channel *chan;
  IRC_Bot *source_local;
  CancelVoteIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (CancelVoteIRCCommand *)nick._M_len;
  pcVar9 = channel._M_str;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)channel._M_len;
  local_48 = pcVar9;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  nick_local._M_str = (char *)servers;
  local_40 = Jupiter::IRC::Client::getChannel(source,servers,pcVar9);
  if (local_40 == 0) {
    return;
  }
  RenX::getCore();
  Jupiter::IRC::Client::Channel::getType();
  RenX::Core::getServers((int)local_70);
  local_58 = local_70;
  bVar6 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_58);
  pcVar5 = nick_local._M_str;
  pCVar2 = chan;
  if (bVar6) {
    bVar10 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
    local_98 = bVar10._M_len;
    local_90 = bVar10._M_str;
    Jupiter::IRC::Client::sendMessage(pCVar2,pcVar5,pcVar9,local_98,local_90);
    goto LAB_001569cf;
  }
  bVar6 = false;
  bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  sVar1 = parameters;
  if (bVar7) {
    bVar6 = true;
  }
  else {
    bVar10 = sv("all",3);
    bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
    sVar1 = parameters;
    if (!bVar7) {
      bVar10 = sv("a",1);
      bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
      sVar1 = parameters;
      if (!bVar7) {
        bVar10 = sv("public",6);
        bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
        sVar1 = parameters;
        if (!bVar7) {
          bVar10 = sv("p",1);
          bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
          sVar1 = parameters;
          if (!bVar7) {
            bVar10 = sv("gdi",3);
            bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
            sVar1 = parameters;
            if (!bVar7) {
              bVar10 = sv("g",1);
              bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
              sVar1 = parameters;
              if (!bVar7) {
                bVar10 = sv("blackhand",9);
                bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
                sVar1 = parameters;
                if (!bVar7) {
                  bVar10 = sv("bh",2);
                  bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
                  sVar1 = parameters;
                  if (!bVar7) {
                    bVar10 = sv("b",1);
                    bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
                    sVar1 = parameters;
                    if (!bVar7) {
                      bVar10 = sv("nod",3);
                      bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
                      sVar1 = parameters;
                      if (!bVar7) {
                        bVar10 = sv("n",1);
                        bVar7 = jessilib::equalsi<char,char>(sVar1,bVar10);
                        sVar4 = nick_local._M_len;
                        pCVar3 = this_local;
                        pCVar2 = chan;
                        if (!bVar7) {
                          bVar10 = sv("Error: Invalid Team. Allowed values are all/a, public/p, gdi/g, nod/n, blackhand/bh/b."
                                      ,0x56);
                          __range2 = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)
                                     bVar10._M_len;
                          local_230 = bVar10._M_str;
                          Jupiter::IRC::Client::sendNotice(pCVar2,pCVar3,sVar4,__range2,local_230);
                          goto LAB_001569cf;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0015685c;
      }
    }
    bVar6 = true;
  }
LAB_0015685c:
  this_00 = local_58;
  if (bVar6) {
    __end2 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_58);
    server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00);
    while (bVar6 = __gnu_cxx::
                   operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                             (&__end2,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                       *)&server), ((bVar6 ^ 0xffU) & 1) != 0) {
      ppSVar8 = __gnu_cxx::
                __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                ::operator*(&__end2);
      if (*ppSVar8 != (Server *)0x0) {
        RenX::Server::cancelVote((TeamType)*ppSVar8);
        RenX::Server::cancelVote((TeamType)*ppSVar8);
        RenX::Server::cancelVote((TeamType)*ppSVar8);
      }
      __gnu_cxx::
      __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    __end2_1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_58);
    server_1 = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00)
    ;
    while (bVar6 = __gnu_cxx::
                   operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                             (&__end2_1,
                              (__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                               *)&server_1), ((bVar6 ^ 0xffU) & 1) != 0) {
      ppSVar8 = __gnu_cxx::
                __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                ::operator*(&__end2_1);
      if (*ppSVar8 != (Server *)0x0) {
        RenX::Server::cancelVote((TeamType)*ppSVar8);
      }
      __gnu_cxx::
      __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
      ::operator++(&__end2_1);
    }
  }
LAB_001569cf:
  std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_70);
  return;
}

Assistant:

void CancelVoteIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	bool cancel_all = false;
	RenX::TeamType target = RenX::TeamType::None;

	if (parameters.empty()) {
		cancel_all = true;
	} else {
		if (jessilib::equalsi(parameters, "all"sv) || jessilib::equalsi(parameters, "a"sv)) {
			cancel_all = true;
		} else if (jessilib::equalsi(parameters, "public"sv) || jessilib::equalsi(parameters, "p"sv)) {
			target = RenX::TeamType::None;
		} else if (jessilib::equalsi(parameters, "gdi"sv) || jessilib::equalsi(parameters, "g"sv)) {
			target = RenX::TeamType::GDI;
		} else if (jessilib::equalsi(parameters, "blackhand"sv) || jessilib::equalsi(parameters, "bh"sv) || jessilib::equalsi(parameters, "b"sv)) {
			target = RenX::TeamType::GDI;
		} else if (jessilib::equalsi(parameters, "nod"sv) || jessilib::equalsi(parameters, "n"sv)) {
			target = RenX::TeamType::Nod;
		} else {
			source->sendNotice(nick, "Error: Invalid Team. Allowed values are all/a, public/p, gdi/g, nod/n, blackhand/bh/b."sv);
			return;
		}
	}

	if (cancel_all) {
		for (const auto& server : servers) {
			if (server == nullptr) {
				continue;
			}

			server->cancelVote(RenX::TeamType::None);
			server->cancelVote(RenX::TeamType::GDI);
			server->cancelVote(RenX::TeamType::Nod);
		}
	} else {
		for (const auto& server : servers) {
			if (server == nullptr) {
				continue;
			}

			server->cancelVote(target);
		}
	}
}